

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_column_mapper.cpp
# Opt level: O1

ColumnMapResult *
duckdb::MapColumn(ColumnMapResult *__return_storage_ptr__,ClientContext *context,
                 MultiFileColumnDefinition *global_column,ColumnIndex *global_index,
                 vector<duckdb::MultiFileColumnDefinition,_true> *param_4,ColumnMapper *mapper,
                 optional_idx top_level_index)

{
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar1;
  unordered_map<unsigned_long,_duckdb::unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>_>_>_>
  *this;
  pointer pCVar2;
  __node_base_ptr p_Var3;
  long lVar4;
  pointer pcVar5;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var6;
  _Head_base<0UL,_duckdb::MultiFileIndexMapping_*,_false> _Var7;
  pointer puVar8;
  undefined8 uVar9;
  _Head_base<0UL,_duckdb::ColumnIndex_*,_false> _Var10;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> uVar11;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var12;
  pointer pCVar13;
  int iVar14;
  undefined4 extraout_var;
  idx_t __n;
  idx_t iVar15;
  _Head_base<0UL,_duckdb::MultiFileIndexMapping_*,_false> _Var16;
  child_list_t<LogicalType> *pcVar17;
  __node_base_ptr p_Var18;
  _Hash_node_base *p_Var19;
  const_reference global_column_00;
  type mapper_00;
  tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_> this_00;
  type __args;
  pointer pMVar20;
  pointer pEVar21;
  pointer pEVar22;
  VariableReturnBindData *pVVar23;
  pointer pCVar24;
  InvalidInputException *this_01;
  ColumnIndex *index;
  pointer pCVar25;
  pointer this_02;
  Expression *__n_00;
  __node_base_ptr p_Var26;
  iterator __end2;
  ColumnIndex *pCVar27;
  bool bVar28;
  unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>
  mapping;
  unique_ptr<duckdb::ColumnMapper,_std::default_delete<duckdb::ColumnMapper>,_true> nested_mapper;
  templated_unique_single_t bind_data;
  child_list_t<Value> column_mapping;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  default_expressions;
  child_list_t<Value> child_list;
  optional_idx entry;
  ColumnMapResult child_map;
  vector<duckdb::ColumnIndex,_true> child_indexes;
  LogicalType default_type;
  unordered_map<unsigned_long,_std::reference_wrapper<const_duckdb::ColumnIndex>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::reference_wrapper<const_duckdb::ColumnIndex>_>_>_>
  selected_children;
  _Head_base<0UL,_duckdb::MultiFileIndexMapping_*,_false> local_3b8;
  const_reference local_3b0;
  ColumnIndex *local_3a8;
  _Head_base<0UL,_duckdb::ColumnMapper_*,_false> local_3a0;
  idx_t local_398;
  _Head_base<0UL,_duckdb::VariableReturnBindData_*,_false> local_390;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  local_388;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  local_368;
  Value local_348;
  undefined1 local_308 [64];
  __uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_> local_2c8;
  optional_ptr<const_duckdb::MultiFileColumnDefinition,_true> local_2c0;
  _Head_base<0UL,_duckdb::ColumnIndex_*,_false> _Stack_2b8;
  _Head_base<0UL,_duckdb::MultiFileIndexMapping_*,_false> local_2b0;
  idx_t local_2a8;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *local_2a0;
  vector<duckdb::MultiFileColumnDefinition,_true> *local_298;
  ClientContext *local_290;
  vector<duckdb::MultiFileColumnDefinition,_true> *local_288;
  optional_idx local_280;
  undefined1 local_278 [16];
  undefined1 local_268 [48];
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> local_238;
  MultiFileColumnDefinition *pMStack_230;
  _Head_base<0UL,_duckdb::ColumnIndex_*,_false> local_228;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_220;
  _Any_data local_1c8;
  _Manager_type local_1b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_158;
  vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_> local_148;
  LogicalType local_130;
  string local_118;
  string local_f8;
  child_list_t<LogicalType> local_d8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  local_b8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  local_98;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::reference_wrapper<const_duckdb::ColumnIndex>_>,_std::allocator<std::pair<const_unsigned_long,_std::reference_wrapper<const_duckdb::ColumnIndex>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_80;
  LogicalType local_48;
  
  local_398 = top_level_index.index;
  local_3a8 = global_index;
  local_290 = context;
  LogicalType::LogicalType((LogicalType *)local_278,SQLNULL);
  Value::Value(&__return_storage_ptr__->column_map,(LogicalType *)local_278);
  LogicalType::~LogicalType((LogicalType *)local_278);
  (__return_storage_ptr__->column_index).
  super_unique_ptr<duckdb::ColumnIndex,_std::default_delete<duckdb::ColumnIndex>_>._M_t.
  super___uniq_ptr_impl<duckdb::ColumnIndex,_std::default_delete<duckdb::ColumnIndex>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnIndex_*,_std::default_delete<duckdb::ColumnIndex>_>.
  super__Head_base<0UL,_duckdb::ColumnIndex_*,_false>._M_head_impl = (ColumnIndex *)0x0;
  (__return_storage_ptr__->mapping).
  super_unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::MultiFileIndexMapping_*,_std::default_delete<duckdb::MultiFileIndexMapping>_>
  .super__Head_base<0UL,_duckdb::MultiFileIndexMapping_*,_false>._M_head_impl =
       (MultiFileIndexMapping *)0x0;
  (__return_storage_ptr__->default_value).
  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  (__return_storage_ptr__->local_column).ptr = (MultiFileColumnDefinition *)0x0;
  iVar14 = (*mapper->_vptr_ColumnMapper[3])(mapper,global_column);
  local_280.index = CONCAT44(extraout_var,iVar14);
  puVar1 = &__return_storage_ptr__->default_value;
  if (local_280.index == 0xffffffffffffffff) {
    (*mapper->_vptr_ColumnMapper[4])
              (local_278,mapper,global_column,(ulong)(local_398 != 0xffffffffffffffff));
    uVar9 = local_278._0_8_;
    local_278._0_8_ = (long *)0x0;
    _Var6._M_head_impl =
         (puVar1->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
         _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (puVar1->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)uVar9;
    if (_Var6._M_head_impl != (Expression *)0x0) {
      (**(code **)(*(long *)&(_Var6._M_head_impl)->super_BaseExpression + 8))();
    }
    if ((long *)local_278._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_278._0_8_ + 8))();
    }
  }
  else {
    __n = optional_idx::GetIndex(&local_280);
    local_3b0 = vector<duckdb::MultiFileColumnDefinition,_true>::operator[](param_4,__n);
    local_3b8._M_head_impl = (MultiFileIndexMapping *)0x0;
    iVar15 = __n;
    if (local_398 != 0xffffffffffffffff) {
      iVar15 = optional_idx::GetIndex(&top_level_index);
    }
    (__return_storage_ptr__->local_column).ptr = local_3b0;
    _Var16._M_head_impl = (MultiFileIndexMapping *)operator_new(0x40);
    _Var7._M_head_impl = local_3b8._M_head_impl;
    (_Var16._M_head_impl)->index = iVar15;
    ((_Var16._M_head_impl)->child_mapping)._M_h._M_buckets =
         &((_Var16._M_head_impl)->child_mapping)._M_h._M_single_bucket;
    ((_Var16._M_head_impl)->child_mapping)._M_h._M_bucket_count = 1;
    ((_Var16._M_head_impl)->child_mapping)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    ((_Var16._M_head_impl)->child_mapping)._M_h._M_element_count = 0;
    ((_Var16._M_head_impl)->child_mapping)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    ((_Var16._M_head_impl)->child_mapping)._M_h._M_rehash_policy._M_next_resize = 0;
    ((_Var16._M_head_impl)->child_mapping)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    if (local_3b8._M_head_impl != (MultiFileIndexMapping *)0x0) {
      this = &(local_3b8._M_head_impl)->child_mapping;
      local_3b8._M_head_impl = _Var16._M_head_impl;
      ::std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&this->_M_h);
      operator_delete(_Var7._M_head_impl);
      _Var16._M_head_impl = local_3b8._M_head_impl;
    }
    local_3b8._M_head_impl = _Var16._M_head_impl;
    if (((global_column->type).id_ == STRUCT) &&
       ((global_column->children).
        super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
        .
        super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (global_column->children).
        super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
        .
        super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      local_298 = &local_3b0->children;
      (*mapper->_vptr_ColumnMapper[2])(&local_3a0,mapper);
      pcVar17 = StructType::GetChildTypes_abi_cxx11_(&global_column->type);
      local_2a8 = __n;
      local_2a0 = puVar1;
      if (((long)(pcVar17->
                 super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                 ).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(pcVar17->
                 super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                 ).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7 +
          ((long)(global_column->children).
                 super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                 .
                 super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(global_column->children).
                 super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                 .
                 super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x79435e50d79435e5 != 0) {
        this_01 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        local_278._0_8_ = local_268;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_278,
                   "Mismatch between field id children in global_column.children and struct children in type"
                   ,"");
        InvalidInputException::InvalidInputException(this_01,(string *)local_278);
        __cxa_throw(this_01,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_388.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_388.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_388.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_368.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_368.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)0x0;
      local_368.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)0x0;
      local_80._M_buckets = &local_80._M_single_bucket;
      local_80._M_bucket_count = 1;
      local_80._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_80._M_element_count = 0;
      local_80._M_rehash_policy._M_max_load_factor = 1.0;
      local_80._M_rehash_policy._M_next_resize = 0;
      local_80._M_single_bucket = (__node_base_ptr)0x0;
      pCVar25 = (local_3a8->child_indexes).
                super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((pCVar25 !=
           (local_3a8->child_indexes).
           super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
           super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
           super__Vector_impl_data._M_finish) &&
         (pCVar2 = (local_3a8->child_indexes).
                   super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                   super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                   _M_impl.super__Vector_impl_data._M_finish, pCVar25 != pCVar2)) {
        do {
          local_278._0_8_ = pCVar25->index;
          ::std::
          _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::reference_wrapper<duckdb::ColumnIndex_const>>,std::allocator<std::pair<unsigned_long_const,std::reference_wrapper<duckdb::ColumnIndex_const>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<unsigned_long,duckdb::ColumnIndex_const&>
                    ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::reference_wrapper<duckdb::ColumnIndex_const>>,std::allocator<std::pair<unsigned_long_const,std::reference_wrapper<duckdb::ColumnIndex_const>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)&local_80,local_278,pCVar25);
          pCVar25 = pCVar25 + 1;
        } while (pCVar25 != pCVar2);
      }
      local_148.super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_148.super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_148.super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if ((global_column->children).
          super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
          .
          super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (global_column->children).
          super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
          .
          super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        local_288 = &global_column->children;
        __n_00 = (Expression *)0x0;
        do {
          pCVar27 = local_3a8;
          if (local_80._M_element_count == 0) {
            bVar28 = true;
          }
          else {
            p_Var3 = local_80._M_buckets[(ulong)__n_00 % local_80._M_bucket_count];
            p_Var18 = (__node_base_ptr)0x0;
            if ((p_Var3 != (__node_base_ptr)0x0) &&
               (p_Var18 = p_Var3, p_Var26 = p_Var3->_M_nxt,
               __n_00 != (Expression *)p_Var3->_M_nxt[1]._M_nxt)) {
              while (p_Var19 = p_Var26->_M_nxt, p_Var19 != (_Hash_node_base *)0x0) {
                p_Var18 = (__node_base_ptr)0x0;
                if (((ulong)p_Var19[1]._M_nxt % local_80._M_bucket_count !=
                     (ulong)__n_00 % local_80._M_bucket_count) ||
                   (p_Var18 = p_Var26, p_Var26 = p_Var19, __n_00 == (Expression *)p_Var19[1]._M_nxt)
                   ) goto LAB_015b88bb;
              }
              p_Var18 = (__node_base_ptr)0x0;
            }
LAB_015b88bb:
            if (p_Var18 == (__node_base_ptr)0x0) {
              p_Var19 = (_Hash_node_base *)0x0;
            }
            else {
              p_Var19 = p_Var18->_M_nxt;
            }
            bVar28 = p_Var19 != (_Hash_node_base *)0x0;
            if (bVar28) {
              pCVar27 = (ColumnIndex *)p_Var19[2]._M_nxt;
            }
          }
          global_column_00 =
               vector<duckdb::MultiFileColumnDefinition,_true>::operator[]
                         (local_288,(size_type)__n_00);
          LogicalType::LogicalType((LogicalType *)local_308,SQLNULL);
          Value::Value((Value *)local_278,(LogicalType *)local_308);
          LogicalType::~LogicalType((LogicalType *)local_308);
          local_228._M_head_impl = (ColumnIndex *)0x0;
          _Stack_220._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_238.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
          _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
               (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
                )0x0;
          pMStack_230 = (MultiFileColumnDefinition *)0x0;
          if (bVar28) {
            mapper_00 = unique_ptr<duckdb::ColumnMapper,_std::default_delete<duckdb::ColumnMapper>,_true>
                        ::operator*((unique_ptr<duckdb::ColumnMapper,_std::default_delete<duckdb::ColumnMapper>,_true>
                                     *)&local_3a0);
            MapColumn((ColumnMapResult *)local_308,local_290,global_column_00,pCVar27,local_298,
                      mapper_00,(optional_idx)0xffffffffffffffff);
            Value::operator=((Value *)local_278,(Value *)local_308);
            uVar11.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
            _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)local_238
            ;
            local_238.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
            ._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)local_2c8
            ;
            local_2c8._M_t.
            super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
                 (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
                 (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
                 0x0;
            if (uVar11.
                super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
                super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
                _M_t.
                super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
                (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
                 )0x0) {
              (**(code **)(*(long *)uVar11.
                                    super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                    ._M_t.
                                    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                                    .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl
                          + 8))();
            }
            _Var10._M_head_impl = local_228._M_head_impl;
            pMStack_230 = local_2c0.ptr;
            local_228._M_head_impl = _Stack_2b8._M_head_impl;
            _Stack_2b8._M_head_impl = (ColumnIndex *)0x0;
            if (_Var10._M_head_impl != (ColumnIndex *)0x0) {
              ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::~vector
                        (&((_Var10._M_head_impl)->child_indexes).
                          super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>);
              operator_delete(_Var10._M_head_impl);
            }
            _Var12._M_pi = _Stack_220._M_pi;
            _Stack_220._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b0._M_head_impl;
            local_2b0._M_head_impl = (MultiFileIndexMapping *)0x0;
            if ((MultiFileIndexMapping *)_Var12._M_pi != (MultiFileIndexMapping *)0x0) {
              ::std::
              _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             *)&(_Var12._M_pi)->_M_use_count);
              operator_delete(_Var12._M_pi);
            }
            _Var7._M_head_impl = local_2b0._M_head_impl;
            if ((__uniq_ptr_impl<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>_>
                 )local_2b0._M_head_impl !=
                (__uniq_ptr_impl<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>_>
                 )0x0) {
              ::std::
              _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             *)((long)local_2b0._M_head_impl + 8));
              operator_delete(_Var7._M_head_impl);
            }
            _Var10._M_head_impl = _Stack_2b8._M_head_impl;
            local_2b0._M_head_impl = (MultiFileIndexMapping *)0x0;
            if ((_Tuple_impl<0UL,_duckdb::ColumnIndex_*,_std::default_delete<duckdb::ColumnIndex>_>)
                _Stack_2b8._M_head_impl != (ColumnIndex *)0x0) {
              ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::~vector
                        ((vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_> *)
                         ((long)_Stack_2b8._M_head_impl + 8));
              operator_delete(_Var10._M_head_impl);
            }
            _Stack_2b8._M_head_impl = (ColumnIndex *)0x0;
            if (local_2c8._M_t.
                super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
                (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
                0x0) {
              (**(code **)(*(long *)local_2c8._M_t.
                                    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                                    .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl
                          + 8))();
            }
            local_2c8._M_t.
            super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
                 (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)0x0;
            Value::~Value((Value *)local_308);
          }
          else {
            LogicalType::LogicalType(&local_48,&global_column_00->type);
            Value::Value(&local_348,&local_48);
            this_00.
            super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
                 (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
                 operator_new(0x98);
            Value::Value((Value *)local_308,&local_348);
            BoundConstantExpression::BoundConstantExpression
                      ((BoundConstantExpression *)
                       this_00.
                       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                       .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl,
                       (Value *)local_308);
            Value::~Value((Value *)local_308);
            if (local_238.
                super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
                super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
                _M_t.
                super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
                (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
                 )0x0) {
              lVar4 = *(long *)local_238.
                               super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                               ._M_t.
                               super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                               .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
              local_238.
              super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
              super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
              _M_t.
              super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
              .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
                   this_00.
                   super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                   .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
              (**(code **)(lVar4 + 8))();
              this_00.
              super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
              .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
                   (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                   )(_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                     )local_238;
            }
            local_238.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
            ._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
                 this_00.
                 super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                 .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
            Value::~Value(&local_348);
            LogicalType::~LogicalType(&local_48);
          }
          if (local_228._M_head_impl != (ColumnIndex *)0x0) {
            __args = unique_ptr<duckdb::ColumnIndex,_std::default_delete<duckdb::ColumnIndex>,_true>
                     ::operator*((unique_ptr<duckdb::ColumnIndex,_std::default_delete<duckdb::ColumnIndex>,_true>
                                  *)&local_228);
            ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::
            emplace_back<duckdb::ColumnIndex>(&local_148,__args);
            pMVar20 = unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>
                      ::operator->((unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>
                                    *)&local_3b8);
            local_308._8_8_ = _Stack_220._M_pi;
            _Stack_220._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_308._0_8_ = __n_00;
            ::std::
            _Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::MultiFileIndexMapping,std::default_delete<duckdb::MultiFileIndexMapping>,true>>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::MultiFileIndexMapping,std::default_delete<duckdb::MultiFileIndexMapping>,true>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::
            _M_emplace<std::pair<unsigned_long,duckdb::unique_ptr<duckdb::MultiFileIndexMapping,std::default_delete<duckdb::MultiFileIndexMapping>,true>>>
                      ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::MultiFileIndexMapping,std::default_delete<duckdb::MultiFileIndexMapping>,true>>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::MultiFileIndexMapping,std::default_delete<duckdb::MultiFileIndexMapping>,true>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)&pMVar20->child_mapping,(ColumnMapResult *)local_308);
            uVar9 = local_308._8_8_;
            if ((MultiFileIndexMapping *)local_308._8_8_ != (MultiFileIndexMapping *)0x0) {
              ::std::
              _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             *)(local_308._8_8_ + 8));
              operator_delete((void *)uVar9);
            }
          }
          if ((bool)local_268[8] == false) {
            ::std::
            vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
            ::emplace_back<std::__cxx11::string_const&,duckdb::Value>
                      ((vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
                        *)&local_388,&global_column_00->name,(Value *)local_278);
          }
          if (local_238.
              super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
              super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
              _M_t.
              super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
              .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
              (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
               )0x0) {
            pEVar21 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      ::operator->(&local_238);
            ::std::__cxx11::string::_M_assign((string *)&(pEVar21->super_BaseExpression).alias);
            ::std::
            vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                        *)&local_368,&local_238);
          }
          _Var12._M_pi = _Stack_220._M_pi;
          if ((MultiFileIndexMapping *)_Stack_220._M_pi != (MultiFileIndexMapping *)0x0) {
            ::std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           *)&(_Stack_220._M_pi)->_M_use_count);
            operator_delete(_Var12._M_pi);
          }
          _Var10._M_head_impl = local_228._M_head_impl;
          _Stack_220._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (local_228._M_head_impl != (ColumnIndex *)0x0) {
            ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::~vector
                      (&((local_228._M_head_impl)->child_indexes).
                        super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>);
            operator_delete(_Var10._M_head_impl);
          }
          local_228._M_head_impl = (ColumnIndex *)0x0;
          if (local_238.
              super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
              super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
              _M_t.
              super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
              .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
              (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
               )0x0) {
            (**(code **)(*(long *)local_238.
                                  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                  ._M_t.
                                  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                                  .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl +
                        8))();
          }
          local_238.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
          _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
               (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
                )0x0;
          Value::~Value((Value *)local_278);
          __n_00 = (Expression *)((long)&(__n_00->super_BaseExpression)._vptr_BaseExpression + 1);
        } while (__n_00 < (Expression *)
                          (((long)(global_column->children).
                                  super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                                  .
                                  super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(global_column->children).
                                  super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                                  .
                                  super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          -0x79435e50d79435e5));
      }
      puVar1 = local_2a0;
      if (local_388.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_388.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_98.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_388.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_98.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_388.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_98.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_388.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_388.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_388.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_388.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        Value::STRUCT((Value *)local_278,(child_list_t<Value> *)&local_98);
        Value::operator=(&__return_storage_ptr__->column_map,(Value *)local_278);
        Value::~Value((Value *)local_278);
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
        ::~vector(&local_98);
        if (local_398 == 0xffffffffffffffff) {
          local_348.type_._0_8_ = (pointer)0x0;
          local_348.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_348.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_308._8_8_ = (MultiFileIndexMapping *)0x0;
          local_308[0x10] = '\0';
          pcVar5 = (local_3b0->name)._M_dataplus._M_p;
          local_308._0_8_ = (Expression *)(local_308 + 0x10);
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_118,pcVar5,pcVar5 + (local_3b0->name)._M_string_length);
          Value::Value((Value *)local_278,&local_118);
          ::std::
          vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
          ::emplace_back<std::__cxx11::string,duckdb::Value>
                    ((vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
                      *)&local_348,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308,
                     (Value *)local_278);
          Value::~Value((Value *)local_278);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p);
          }
          if ((Expression *)local_308._0_8_ != (Expression *)(local_308 + 0x10)) {
            operator_delete((void *)local_308._0_8_);
          }
          local_278._8_8_ = (element_type *)0x0;
          local_268._0_8_ = local_268._0_8_ & 0xffffffffffffff00;
          local_278._0_8_ = (Expression *)local_268;
          ::std::
          vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
          ::emplace_back<std::__cxx11::string,duckdb::Value>
                    ((vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
                      *)&local_348,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278,
                     &__return_storage_ptr__->column_map);
          if ((Expression *)local_278._0_8_ != (Expression *)local_268) {
            operator_delete((void *)local_278._0_8_);
          }
          local_b8.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)local_348.type_._0_8_;
          local_b8.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (pointer)local_348.type_.type_info_.internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          ;
          local_b8.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)local_348.type_.type_info_.internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
          local_348.type_.id_ = INVALID;
          local_348.type_.physical_type_ = ~INVALID;
          local_348.type_._2_6_ = 0;
          local_348.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_348.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          Value::STRUCT((Value *)local_278,(child_list_t<Value> *)&local_b8);
          Value::operator=(&__return_storage_ptr__->column_map,(Value *)local_278);
          Value::~Value((Value *)local_278);
          ::std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
          ::~vector(&local_b8);
          ::std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
          ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                     *)&local_348);
        }
      }
      puVar8 = local_368.
               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_368.
          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_368.
          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_348.type_._0_8_ = (pointer)0x0;
        local_348.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_348.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        this_02 = local_368.
                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          pEVar21 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator->(this_02);
          pEVar22 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator->(this_02);
          ::std::
          vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
          ::emplace_back<std::__cxx11::string_const&,duckdb::LogicalType&>
                    ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                      *)&local_348,&(pEVar21->super_BaseExpression).alias,&pEVar22->return_type);
          this_02 = this_02 + 1;
        } while (this_02 != puVar8);
        local_d8.
        super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        .
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_348.type_._0_8_;
        local_d8.
        super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        .
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)local_348.type_.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_d8.
        super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        .
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)local_348.type_.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        local_348.type_.id_ = INVALID;
        local_348.type_.physical_type_ = ~INVALID;
        local_348.type_._2_6_ = 0;
        local_348.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_348.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        LogicalType::STRUCT(&local_130,&local_d8);
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                   *)&local_d8);
        StructPackFun::GetFunction();
        pVVar23 = (VariableReturnBindData *)operator_new(0x20);
        LogicalType::LogicalType((LogicalType *)local_308,&local_130);
        (pVVar23->super_FunctionData)._vptr_FunctionData =
             (_func_int **)&PTR__VariableReturnBindData_0249bc98;
        LogicalType::LogicalType(&pVVar23->stype,(LogicalType *)local_308);
        local_390._M_head_impl = pVVar23;
        LogicalType::~LogicalType((LogicalType *)local_308);
        make_uniq<duckdb::BoundFunctionExpression,duckdb::LogicalType,duckdb::ScalarFunction,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,duckdb::unique_ptr<duckdb::VariableReturnBindData,std::default_delete<duckdb::VariableReturnBindData>,true>>
                  ((duckdb *)local_308,&local_130,(ScalarFunction *)local_278,&local_368,
                   (unique_ptr<duckdb::VariableReturnBindData,_std::default_delete<duckdb::VariableReturnBindData>,_true>
                    *)&local_390);
        uVar9 = local_308._0_8_;
        local_308._0_8_ = (Expression *)0x0;
        _Var6._M_head_impl =
             (puVar1->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (puVar1->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
        _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)uVar9;
        if (_Var6._M_head_impl != (Expression *)0x0) {
          (**(code **)(*(long *)&(_Var6._M_head_impl)->super_BaseExpression + 8))();
        }
        if ((Expression *)local_308._0_8_ != (Expression *)0x0) {
          (*(code *)(*(_Hash_node_base **)local_308._0_8_)[1]._M_nxt)();
        }
        if (local_390._M_head_impl != (VariableReturnBindData *)0x0) {
          (*((local_390._M_head_impl)->super_FunctionData)._vptr_FunctionData[1])();
        }
        local_278._0_8_ = &PTR__ScalarFunction_0247c280;
        if (local_158._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_158._M_pi);
        }
        if (local_1b8 != (_Manager_type)0x0) {
          (*local_1b8)(&local_1c8,&local_1c8,__destroy_functor);
        }
        BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_278);
        LogicalType::~LogicalType(&local_130);
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                   *)&local_348);
      }
      pCVar24 = (pointer)operator_new(0x20);
      pCVar13 = local_148.
                super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
      pCVar2 = local_148.
               super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl
               .super__Vector_impl_data._M_finish;
      pCVar25 = local_148.
                super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                _M_impl.super__Vector_impl_data._M_start;
      local_148.super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_148.super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_148.super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pCVar24->index = local_2a8;
      (pCVar24->child_indexes).
      super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
      super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
      super__Vector_impl_data._M_start = pCVar25;
      (pCVar24->child_indexes).
      super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
      super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
      super__Vector_impl_data._M_finish = pCVar2;
      (pCVar24->child_indexes).
      super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
      super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = pCVar13;
      local_268._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_278._0_8_ = (Expression *)0x0;
      local_278._8_8_ = (element_type *)0x0;
      ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::~vector
                ((vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_> *)local_278);
      ::std::__uniq_ptr_impl<duckdb::ColumnIndex,_std::default_delete<duckdb::ColumnIndex>_>::reset
                ((__uniq_ptr_impl<duckdb::ColumnIndex,_std::default_delete<duckdb::ColumnIndex>_> *)
                 &__return_storage_ptr__->column_index,pCVar24);
      _Var7._M_head_impl = local_3b8._M_head_impl;
      local_3b8._M_head_impl = (MultiFileIndexMapping *)0x0;
      ::std::
      __uniq_ptr_impl<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>_>
      ::reset((__uniq_ptr_impl<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>_>
               *)&__return_storage_ptr__->mapping,_Var7._M_head_impl);
      ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::~vector(&local_148);
      ::std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::reference_wrapper<const_duckdb::ColumnIndex>_>,_std::allocator<std::pair<const_unsigned_long,_std::reference_wrapper<const_duckdb::ColumnIndex>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_80);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)&local_368);
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ::~vector(&local_388);
      if (local_3a0._M_head_impl != (ColumnMapper *)0x0) {
        (*(local_3a0._M_head_impl)->_vptr_ColumnMapper[1])();
      }
    }
    else {
      pcVar5 = (local_3b0->name)._M_dataplus._M_p;
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f8,pcVar5,pcVar5 + (local_3b0->name)._M_string_length);
      Value::Value((Value *)local_278,&local_f8);
      Value::operator=(&__return_storage_ptr__->column_map,(Value *)local_278);
      Value::~Value((Value *)local_278);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p);
      }
      pCVar24 = (pointer)operator_new(0x20);
      pCVar24->index = __n;
      (pCVar24->child_indexes).
      super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
      super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pCVar24->child_indexes).
      super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
      super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pCVar24->child_indexes).
      super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
      super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ::std::__uniq_ptr_impl<duckdb::ColumnIndex,_std::default_delete<duckdb::ColumnIndex>_>::reset
                ((__uniq_ptr_impl<duckdb::ColumnIndex,_std::default_delete<duckdb::ColumnIndex>_> *)
                 &__return_storage_ptr__->column_index,pCVar24);
      _Var7._M_head_impl = local_3b8._M_head_impl;
      local_3b8._M_head_impl = (MultiFileIndexMapping *)0x0;
      ::std::
      __uniq_ptr_impl<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>_>
      ::reset((__uniq_ptr_impl<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>_>
               *)&__return_storage_ptr__->mapping,_Var7._M_head_impl);
    }
    _Var7._M_head_impl = local_3b8._M_head_impl;
    if (local_3b8._M_head_impl != (MultiFileIndexMapping *)0x0) {
      ::std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&((local_3b8._M_head_impl)->child_mapping)._M_h);
      operator_delete(_Var7._M_head_impl);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ColumnMapResult MapColumn(ClientContext &context, const MultiFileColumnDefinition &global_column,
                          const ColumnIndex &global_index, const vector<MultiFileColumnDefinition> &local_columns,
                          const ColumnMapper &mapper, optional_idx top_level_index = optional_idx()) {
	bool is_root = top_level_index.IsValid();
	ColumnMapResult result;
	auto entry = mapper.Find(global_column);
	if (!entry.IsValid()) {
		// entry not present in map, use default value
		result.default_value = mapper.GetDefaultExpression(global_column, is_root);
		return result;
	}
	// the field exists! get the local column
	MultiFileLocalColumnId local_id(entry.GetIndex());
	auto &local_column = local_columns[local_id.GetId()];
	unique_ptr<MultiFileIndexMapping> mapping;
	idx_t mapping_idx;
	if (is_root) {
		// root expression - refer to it directly
		mapping_idx = top_level_index.GetIndex();
	} else {
		// extract the field from the parent
		mapping_idx = local_id.GetId();
	}
	result.local_column = local_column;
	mapping = make_uniq<MultiFileIndexMapping>(mapping_idx);
	if (global_column.type.id() != LogicalTypeId::STRUCT || global_column.children.empty()) {
		// not a struct - map the column directly
		result.column_map = Value(local_column.name);
		result.column_index = make_uniq<ColumnIndex>(local_id.GetId());
		result.mapping = std::move(mapping);
		return result;
	}
	// nested type - check if the field identifiers match and if we need to remap
	auto nested_mapper = mapper.Create(local_column.children);
	auto &struct_children = StructType::GetChildTypes(global_column.type);
	if (struct_children.size() != global_column.children.size()) {
		throw InvalidInputException(
		    "Mismatch between field id children in global_column.children and struct children in type");
	}
	child_list_t<Value> column_mapping;
	vector<unique_ptr<Expression>> default_expressions;
	unordered_map<idx_t, const_reference<ColumnIndex>> selected_children;
	if (global_index.HasChildren()) {
		for (auto &index : global_index.GetChildIndexes()) {
			selected_children.emplace(index.GetPrimaryIndex(), index);
		}
	}

	vector<ColumnIndex> child_indexes;
	for (idx_t i = 0; i < global_column.children.size(); i++) {
		bool is_selected = true;
		const_reference<ColumnIndex> global_child_index = global_index;
		if (!selected_children.empty()) {
			auto entry = selected_children.find(i);
			if (entry != selected_children.end()) {
				// the column is relevent - set the child index
				global_child_index = entry->second;
			} else {
				// not relevant - ignore the column
				is_selected = false;
			}
		}
		auto &global_child = global_column.children[i];
		ColumnMapResult child_map;
		if (is_selected) {
			child_map =
			    MapColumn(context, global_child, global_child_index.get(), local_column.children, *nested_mapper);
		} else {
			// column is not relevant for the query - push a NULL value
			child_map.default_value = make_uniq<BoundConstantExpression>(Value(global_child.type));
		}
		if (child_map.column_index) {
			child_indexes.push_back(std::move(*child_map.column_index));
			mapping->child_mapping.insert(make_pair(i, std::move(child_map.mapping)));
		}
		if (!child_map.column_map.IsNull()) {
			// found a column mapping for this child - emplace it
			column_mapping.emplace_back(global_child.name, std::move(child_map.column_map));
		}
		if (child_map.default_value) {
			// found a default value for this child - emplace it
			child_map.default_value->alias = global_child.name;
			default_expressions.push_back(std::move(child_map.default_value));
		}
	}
	if (!column_mapping.empty()) {
		// we have column mappings at this level - construct the struct
		result.column_map = Value::STRUCT(std::move(column_mapping));
		if (!is_root) {
			// if this is nested we need to refer to the current column at this level
			child_list_t<Value> child_list;
			child_list.emplace_back(string(), Value(local_column.name));
			child_list.emplace_back(string(), std::move(result.column_map));
			result.column_map = Value::STRUCT(std::move(child_list));
		}
	}
	if (!default_expressions.empty()) {
		// we have default values at this level - construct the struct pack
		child_list_t<LogicalType> default_type_list;
		for (auto &expr : default_expressions) {
			default_type_list.emplace_back(expr->GetAlias(), expr->return_type);
		}
		auto default_type = LogicalType::STRUCT(std::move(default_type_list));
		auto struct_pack_fun = StructPackFun::GetFunction();
		auto bind_data = make_uniq<VariableReturnBindData>(default_type);
		result.default_value = make_uniq<BoundFunctionExpression>(std::move(default_type), std::move(struct_pack_fun),
		                                                          std::move(default_expressions), std::move(bind_data));
	}
	result.column_index = make_uniq<ColumnIndex>(local_id.GetId(), std::move(child_indexes));
	result.mapping = std::move(mapping);
	return result;
}